

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

int region_get_data(region *reg,char *buf,int len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  line *plVar4;
  int iVar5;
  
  iVar5 = reg->r_offset;
  plVar4 = reg->r_linep;
  uVar2 = 0;
  uVar1 = (ulong)(uint)len;
  if (len < 1) {
    uVar1 = uVar2;
  }
  do {
    uVar3 = uVar1;
    if (uVar1 == uVar2) {
LAB_0011504d:
      buf[uVar3] = '\0';
      return (int)uVar1;
    }
    if (iVar5 == plVar4->l_used) {
      plVar4 = plVar4->l_fp;
      if (plVar4 == curbp->b_headp) {
        uVar1 = uVar2 & 0xffffffff;
        uVar3 = uVar2;
        goto LAB_0011504d;
      }
      buf[uVar2] = *curbp->b_nlchr;
      iVar5 = 0;
    }
    else {
      buf[uVar2] = plVar4->l_text[iVar5];
      iVar5 = iVar5 + 1;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int
region_get_data(struct region *reg, char *buf, int len)
{
	int	 i, off;
	struct line	*lp;

	off = reg->r_offset;
	lp = reg->r_linep;
	for (i = 0; i < len; i++) {
		if (off == llength(lp)) {
			lp = lforw(lp);
			if (lp == curbp->b_headp)
				break;
			off = 0;
			buf[i] = *curbp->b_nlchr;
		} else {
			buf[i] = lgetc(lp, off);
			off++;
		}
	}
	buf[i] = '\0';
	return (i);
}